

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerFastAllocator.h
# Opt level: O1

void Memory::RecyclerFastAllocator<Js::JavascriptNumber,_(Memory::ObjectInfoBits)32>::
     TrackNativeAllocatedObject(Recycler *recycler,void *memBlock,size_t sizeCat)

{
  undefined1 auStack_48 [8];
  TrackAllocData trackAllocData;
  
  trackAllocData.filename = (char *)0x0;
  trackAllocData.plusSize = 0xffffffffffffffff;
  trackAllocData.count = 0;
  auStack_48 = (undefined1  [8])&Js::JavascriptNumber::typeinfo;
  trackAllocData.typeinfo = (type_info *)0x0;
  Recycler::TrackAlloc(recycler,memBlock,8,(TrackAllocData *)auStack_48,false);
  RecyclerMemoryTracking::ReportAllocation(recycler,memBlock,8);
  Recycler::FillCheckPad(recycler,memBlock,8,sizeCat,true);
  return;
}

Assistant:

static void TrackNativeAllocatedObject(Recycler * recycler, void * memBlock, size_t sizeCat)
    {
#ifdef PROFILE_RECYCLER_ALLOC
        TrackAllocData trackAllocData = { &typeid(T), 0, (size_t)-1, NULL, 0 };
        recycler->TrackAlloc(memBlock, sizeof(T), trackAllocData);
#endif
        RecyclerMemoryTracking::ReportAllocation(recycler, memBlock, sizeof(T));
        RECYCLER_PERF_COUNTER_INC(LiveObject);
        RECYCLER_PERF_COUNTER_ADD(LiveObjectSize, sizeCat);
        RECYCLER_PERF_COUNTER_SUB(FreeObjectSize, sizeCat);

        RECYCLER_PERF_COUNTER_INC(SmallHeapBlockLiveObject);
        RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObjectSize, sizeCat);
        RECYCLER_PERF_COUNTER_SUB(SmallHeapBlockFreeObjectSize, sizeCat);

#ifdef RECYCLER_MEMORY_VERIFY
        recycler->FillCheckPad(memBlock, sizeof(T), sizeCat, true);
#endif
    }